

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageTests.cpp
# Opt level: O2

string * __thiscall
vkt::pipeline::(anonymous_namespace)::ImageTest::getGlslSampler_abi_cxx11_
          (string *__return_storage_ptr__,ImageTest *this,TextureFormat *format,VkImageViewType type
          ,VkDescriptorType samplingType,int imageCount)

{
  VkImageViewType type_00;
  char *__s;
  char *__s_00;
  string texSampler;
  string texImage;
  char *local_c8;
  size_type local_c0;
  char local_b8;
  undefined7 uStack_b7;
  undefined8 uStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __s = "texSampler";
  if (1 < (int)samplingType) {
    __s = "texSamplers[i]";
  }
  __s_00 = "texImage";
  if (1 < (int)samplingType) {
    __s_00 = "texImages[i]";
  }
  type_00 = type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,__s,(allocator<char> *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,__s_00,(allocator<char> *)&local_a8);
  if (type == VK_IMAGE_VIEW_TYPE_3D) {
    getGlslSamplerType_abi_cxx11_
              (&local_68,this,(TextureFormat *)((ulong)format & 0xffffffff),type_00);
    std::operator+(&local_48,&local_68,"(");
    std::operator+(&local_a8,&local_48,&local_88);
    std::operator+(__return_storage_ptr__,&local_a8,", texSampler)");
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_c8 == &local_b8) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_b7,local_b8);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_b0;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_c8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_b7,local_b8);
    }
    __return_storage_ptr__->_M_string_length = local_c0;
    local_c0 = 0;
    local_b8 = '\0';
    local_c8 = &local_b8;
  }
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageTest::getGlslSampler (const tcu::TextureFormat& format, VkImageViewType type, VkDescriptorType samplingType, int imageCount)
{
	std::string texSampler	= imageCount > 1 ? "texSamplers[i]" : "texSampler";
	std::string texImage	= imageCount > 1 ? "texImages[i]" : "texImage";

	switch (samplingType)
	{
		case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
			return getGlslSamplerType(format, type) + "(" + texImage + ", texSampler)";
		case VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
		default:
			return texSampler;
	}
}